

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O0

void __thiscall rtosc::UndoHistory::seekHistory(UndoHistory *this,int distance)

{
  long lVar1;
  size_type sVar2;
  reference pvVar3;
  int in_ESI;
  size_type *in_RDI;
  UndoHistoryImpl *unaff_retaddr;
  long dest;
  size_type in_stack_ffffffffffffffc8;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
  *in_stack_ffffffffffffffd0;
  UndoHistoryImpl *this_00;
  int local_c;
  size_type *msg;
  
  lVar1 = *(long *)(*in_RDI + 0x50) + (long)in_ESI;
  local_c = in_ESI;
  if (lVar1 < 0) {
    local_c = in_ESI - (int)lVar1;
  }
  msg = in_RDI;
  sVar2 = std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
          ::size((deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                  *)0x124b5b);
  if ((long)sVar2 < lVar1) {
    sVar2 = std::
            deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
            size((deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                  *)0x124b75);
    local_c = (int)sVar2 - (int)*(undefined8 *)(*in_RDI + 0x50);
  }
  if (local_c != 0) {
    if (local_c < 0) {
      while (local_c != 0) {
        this_00 = (UndoHistoryImpl *)*in_RDI;
        *(long *)(*in_RDI + 0x50) = *(long *)(*in_RDI + 0x50) + -1;
        pvVar3 = std::
                 deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ::operator[]((deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                               *)this_00,in_stack_ffffffffffffffc8);
        UndoHistoryImpl::rewind(this_00,(FILE *)pvVar3->second);
        local_c = local_c + 1;
      }
    }
    else {
      while (local_c != 0) {
        sVar2 = *in_RDI;
        *(long *)(*in_RDI + 0x50) = *(long *)(*in_RDI + 0x50) + 1;
        std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
        operator[](in_stack_ffffffffffffffd0,sVar2);
        UndoHistoryImpl::replay(unaff_retaddr,(char *)msg);
        local_c = local_c + -1;
      }
    }
  }
  return;
}

Assistant:

void UndoHistory::seekHistory(int distance)
{
    //TODO print out the events that would need to take place to get to the
    //final destination
    
    //TODO limit the distance to be to applicable sizes
    //ie ones that do not exceed the known history/future
    long dest = impl->history_pos + distance;
    if(dest < 0)
        distance -= dest;
    if(dest > (long) impl->history.size())
        distance  = impl->history.size() - impl->history_pos;
    if(!distance)
        return;
    
    //TODO account for traveling back in time
    if(distance<0)
        while(distance++)
            impl->rewind(impl->history[--impl->history_pos].second);
    else
        while(distance--)
            impl->replay(impl->history[impl->history_pos++].second);
}